

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_string_field.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::RepeatedStringFieldGenerator::GenerateParsingCode
          (RepeatedStringFieldGenerator *this,Printer *printer)

{
  io::Printer::Print(printer,&this->variables_,
                     "if (!$get_mutable_bit_parser$) {\n  $name$_ = new com.google.protobuf.LazyStringArrayList();\n  $set_mutable_bit_parser$;\n}\n$name$_.add(input.readBytes());\n"
                    );
  return;
}

Assistant:

void RepeatedStringFieldGenerator::
GenerateParsingCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (!$get_mutable_bit_parser$) {\n"
    "  $name$_ = new com.google.protobuf.LazyStringArrayList();\n"
    "  $set_mutable_bit_parser$;\n"
    "}\n"
    "$name$_.add(input.readBytes());\n");
}